

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseCleared<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  LogMessage *pLVar1;
  Rep *pRVar2;
  int iVar3;
  LogMessage local_58;
  LogFinisher local_19;
  
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x80b);
    pLVar1 = LogMessage::operator<<(&local_58,"CHECK failed: GetArena() == NULL: ");
    pLVar1 = LogMessage::operator<<
                       (pLVar1,"ReleaseCleared() can only be used on a RepeatedPtrField not on ");
    pLVar1 = LogMessage::operator<<(pLVar1,"an arena.");
    LogFinisher::operator=(&local_19,pLVar1);
    LogMessage::~LogMessage(&local_58);
    if (this->arena_ != (Arena *)0x0) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
                 ,0x80e);
      pLVar1 = LogMessage::operator<<(&local_58,"CHECK failed: GetArena() == NULL: ");
      LogFinisher::operator=(&local_19,pLVar1);
      LogMessage::~LogMessage(&local_58);
    }
  }
  pRVar2 = this->rep_;
  if (pRVar2 == (Rep *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x80f);
    pLVar1 = LogMessage::operator<<(&local_58,"CHECK failed: rep_ != NULL: ");
    LogFinisher::operator=(&local_19,pLVar1);
    LogMessage::~LogMessage(&local_58);
    pRVar2 = this->rep_;
  }
  iVar3 = pRVar2->allocated_size;
  if (iVar3 <= this->current_size_) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x810);
    pLVar1 = LogMessage::operator<<
                       (&local_58,"CHECK failed: (rep_->allocated_size) > (current_size_): ");
    LogFinisher::operator=(&local_19,pLVar1);
    LogMessage::~LogMessage(&local_58);
    pRVar2 = this->rep_;
    iVar3 = pRVar2->allocated_size;
  }
  pRVar2->allocated_size = iVar3 + -1;
  return (Type *)pRVar2->elements[(long)iVar3 + -1];
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::ReleaseCleared() {
  GOOGLE_DCHECK(GetArena() == NULL)
      << "ReleaseCleared() can only be used on a RepeatedPtrField not on "
      << "an arena.";
  GOOGLE_DCHECK(GetArena() == NULL);
  GOOGLE_DCHECK(rep_ != NULL);
  GOOGLE_DCHECK_GT(rep_->allocated_size, current_size_);
  return cast<TypeHandler>(rep_->elements[--rep_->allocated_size]);
}